

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11disp.c
# Opt level: O3

X11Display * x11_setup_display(char *display,Conf *conf,char **error_msg)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  X11Display *disp;
  X11Display *s;
  SockAddr *pSVar4;
  char *pcVar5;
  SockAddr *cmp;
  _STACK *p_Var6;
  long lVar7;
  X11Display *pXVar8;
  X11Display *s_00;
  _Bool _Var9;
  
  disp = (X11Display *)safemalloc(1,0x50,0);
  *error_msg = (char *)0x0;
  if ((display == (char *)0x0) || (*display == '\0')) {
    s = (X11Display *)platform_get_x_display();
    if ((s == (X11Display *)0x0) || (cVar2 = s->unixdomain, (_Bool)cVar2 == false)) {
      safefree(s);
      display = ":0";
      goto LAB_00144409;
    }
  }
  else {
LAB_00144409:
    s = (X11Display *)dupstr(display);
    cVar2 = s->unixdomain;
  }
  if (cVar2 == '/') {
    disp->unixsocketpath = &s->unixdomain;
    disp->unixdomain = true;
    disp->hostname = (char *)0x0;
    disp->displaynum = -1;
    disp->screennum = 0;
    disp->addr = (SockAddr *)0x0;
  }
  else {
    pcVar5 = host_strrchr(&s->unixdomain,0x3a);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = dupprintf("display name \'%s\' has no \':number\' suffix",s);
      *error_msg = pcVar5;
      safefree(disp);
LAB_0014466c:
      safefree(s);
      return (X11Display *)0x0;
    }
    pXVar8 = (X11Display *)(pcVar5 + 1);
    *pcVar5 = '\0';
    pcVar5 = strchr((char *)pXVar8,0x2e);
    if (pcVar5 == (char *)0x0) {
      iVar3 = atoi((char *)pXVar8);
      disp->displaynum = iVar3;
      iVar3 = 0;
    }
    else {
      *pcVar5 = '\0';
      iVar3 = atoi((char *)pXVar8);
      disp->displaynum = iVar3;
      iVar3 = atoi(pcVar5 + 1);
    }
    disp->screennum = iVar3;
    if ((s < pXVar8) && (pcVar5 = strchr(&s->unixdomain,0x2f), pcVar5 != (char *)0x0)) {
      *pcVar5 = '\0';
      pXVar8 = s;
      s_00 = (X11Display *)(pcVar5 + 1);
    }
    else {
      pXVar8 = (X11Display *)0x0;
      s_00 = s;
    }
    if (s_00->unixdomain == false) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = dupstr(&s_00->unixdomain);
    }
    disp->hostname = pcVar5;
    if (pXVar8 == (X11Display *)0x0) {
      if ((s_00->unixdomain == false) || (iVar3 = strcmp(&s_00->unixdomain,"unix"), iVar3 == 0)) {
        _Var9 = true;
      }
      else {
        _Var9 = false;
      }
    }
    else {
      iVar3 = strcmp(&pXVar8->unixdomain,"local");
      if (iVar3 == 0) {
        _Var9 = true;
      }
      else {
        iVar3 = strcmp(&pXVar8->unixdomain,"unix");
        _Var9 = iVar3 == 0;
      }
    }
    disp->unixdomain = _Var9;
    if ((pcVar5 == (char *)0x0) && (_Var9 == false)) {
      pcVar5 = dupstr("localhost");
      disp->hostname = pcVar5;
    }
    disp->unixsocketpath = (char *)0x0;
    disp->addr = (SockAddr *)0x0;
    safefree(s);
    bVar1 = disp->unixdomain;
    if ((bVar1 & 1) == 0) {
      iVar3 = disp->displaynum + 6000;
      disp->port = iVar3;
      pSVar4 = name_lookup(disp->hostname,iVar3,&disp->realhost,conf,0,(LogContext *)0x0,(char *)0x0
                          );
      disp->addr = pSVar4;
      pcVar5 = sk_addr_error(pSVar4);
      if (pcVar5 != (char *)0x0) {
        pcVar5 = dupprintf("unable to resolve host name \'%s\' in display name",disp->hostname);
        *error_msg = pcVar5;
        sk_addr_free(disp->addr);
        safefree(disp->hostname);
        safefree(disp->unixsocketpath);
        s = disp;
        goto LAB_0014466c;
      }
      bVar1 = disp->unixdomain;
    }
    if (((bVar1 & 1) == 0) && (_Var9 = sk_address_is_local(disp->addr), _Var9)) {
      pSVar4 = platform_get_x11_unix_address((char *)0x0,disp->displaynum);
      pcVar5 = sk_addr_error(pSVar4);
      if (pcVar5 == (char *)0x0) {
        cmp = sk_addr_dup(pSVar4);
        p_Var6 = sk_new((cmp *)cmp);
        lVar7 = (**(code **)(*(long *)p_Var6 + 0x30))(p_Var6);
        (**(code **)(*(long *)p_Var6 + 8))(p_Var6);
        if (lVar7 == 0) {
          sk_addr_free(disp->addr);
          disp->unixdomain = true;
          disp->addr = pSVar4;
          goto LAB_00144434;
        }
      }
      sk_addr_free(pSVar4);
    }
  }
LAB_00144434:
  if (disp->unixdomain == true) {
    if (disp->addr == (SockAddr *)0x0) {
      pSVar4 = platform_get_x11_unix_address(disp->unixsocketpath,disp->displaynum);
      disp->addr = pSVar4;
    }
    if (disp->unixsocketpath == (char *)0x0) {
      pcVar5 = dupprintf("unix:%d",(ulong)(uint)disp->displaynum);
    }
    else {
      pcVar5 = dupstr(disp->unixsocketpath);
    }
    disp->realhost = pcVar5;
    disp->port = 0;
  }
  disp->localauthproto = 0;
  disp->localauthdata = (uchar *)0x0;
  disp->localauthdatalen = 0;
  platform_get_x11_auth(disp,conf);
  return disp;
}

Assistant:

struct X11Display *x11_setup_display(const char *display, Conf *conf,
                                     char **error_msg)
{
    struct X11Display *disp = snew(struct X11Display);
    char *localcopy;

    *error_msg = NULL;

    if (!display || !*display) {
        localcopy = platform_get_x_display();
        if (!localcopy || !*localcopy) {
            sfree(localcopy);
            localcopy = dupstr(":0");  /* plausible default for any platform */
        }
    } else
        localcopy = dupstr(display);

    /*
     * Parse the display name.
     *
     * We expect this to have one of the following forms:
     *
     *  - the standard X format which looks like
     *    [ [ protocol '/' ] host ] ':' displaynumber [ '.' screennumber ]
     *    (X11 also permits a double colon to indicate DECnet, but
     *    that's not our problem, thankfully!)
     *
     *  - only seen in the wild on MacOS (so far): a pathname to a
     *    Unix-domain socket, which will typically and confusingly
     *    end in ":0", and which I'm currently distinguishing from
     *    the standard scheme by noting that it starts with '/'.
     */
    if (localcopy[0] == '/') {
        disp->unixsocketpath = localcopy;
        disp->unixdomain = true;
        disp->hostname = NULL;
        disp->displaynum = -1;
        disp->screennum = 0;
        disp->addr = NULL;
    } else {
        char *colon, *dot, *slash;
        char *protocol, *hostname;

        colon = host_strrchr(localcopy, ':');
        if (!colon) {
            *error_msg = dupprintf("display name '%s' has no ':number'"
                                   " suffix", localcopy);

            sfree(disp);
            sfree(localcopy);
            return NULL;
        }

        *colon++ = '\0';
        dot = strchr(colon, '.');
        if (dot)
            *dot++ = '\0';

        disp->displaynum = atoi(colon);
        if (dot)
            disp->screennum = atoi(dot);
        else
            disp->screennum = 0;

        protocol = NULL;
        hostname = localcopy;
        if (colon > localcopy) {
            slash = strchr(localcopy, '/');
            if (slash) {
                *slash++ = '\0';
                protocol = localcopy;
                hostname = slash;
            }
        }

        disp->hostname = *hostname ? dupstr(hostname) : NULL;

        if (protocol)
            disp->unixdomain = (!strcmp(protocol, "local") ||
                                !strcmp(protocol, "unix"));
        else if (!*hostname || !strcmp(hostname, "unix"))
            disp->unixdomain = platform_uses_x11_unix_by_default;
        else
            disp->unixdomain = false;

        if (!disp->hostname && !disp->unixdomain)
            disp->hostname = dupstr("localhost");

        disp->unixsocketpath = NULL;
        disp->addr = NULL;

        sfree(localcopy);
    }

    /*
     * Look up the display hostname, if we need to.
     */
    if (!disp->unixdomain) {
        const char *err;

        disp->port = 6000 + disp->displaynum;
        disp->addr = name_lookup(disp->hostname, disp->port,
                                 &disp->realhost, conf, ADDRTYPE_UNSPEC,
                                 NULL, NULL);

        if ((err = sk_addr_error(disp->addr)) != NULL) {
            *error_msg = dupprintf("unable to resolve host name '%s' in "
                                   "display name", disp->hostname);

            sk_addr_free(disp->addr);
            sfree(disp->hostname);
            sfree(disp->unixsocketpath);
            sfree(disp);
            return NULL;
        }
    }

    /*
     * Try upgrading an IP-style localhost display to a Unix-socket
     * display (as the standard X connection libraries do).
     */
    if (!disp->unixdomain && sk_address_is_local(disp->addr)) {
        SockAddr *ux = platform_get_x11_unix_address(NULL, disp->displaynum);
        const char *err = sk_addr_error(ux);
        if (!err) {
            /* Create trial connection to see if there is a useful Unix-domain
             * socket */
            Socket *s = sk_new(sk_addr_dup(ux), 0, false, false,
                               false, false, nullplug);
            err = sk_socket_error(s);
            sk_close(s);
        }
        if (err) {
            sk_addr_free(ux);
        } else {
            sk_addr_free(disp->addr);
            disp->unixdomain = true;
            disp->addr = ux;
            /* Fill in the rest in a moment */
        }
    }

    if (disp->unixdomain) {
        if (!disp->addr)
            disp->addr = platform_get_x11_unix_address(disp->unixsocketpath,
                                                       disp->displaynum);
        if (disp->unixsocketpath)
            disp->realhost = dupstr(disp->unixsocketpath);
        else
            disp->realhost = dupprintf("unix:%d", disp->displaynum);
        disp->port = 0;
    }

    /*
     * Fetch the local authorisation details.
     */
    disp->localauthproto = X11_NO_AUTH;
    disp->localauthdata = NULL;
    disp->localauthdatalen = 0;
    platform_get_x11_auth(disp, conf);

    return disp;
}